

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::append(QString *this,QString *str)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QArrayDataPointer<char16_t> *in_RSI;
  QAnyStringView *in_RDI;
  long in_FS_OFFSET;
  QAnyStringView in_stack_00000000;
  QString *in_stack_ffffffffffffffc8;
  QAnyStringView *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = isNull((QString *)0x509ec4);
  if (!bVar2) {
    bVar2 = isNull((QString *)0x509ed6);
    if (bVar2) {
      bVar2 = QArrayDataPointer<char16_t>::isMutable(in_RSI);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        operator=((QString *)in_RDI,in_stack_ffffffffffffffc8);
      }
      else {
        QAnyStringView::QAnyStringView(this_00,(QString *)in_RSI);
        assign((QString *)in_RSI,in_stack_00000000);
      }
    }
    else {
      qVar3 = size((QString *)in_RSI);
      if (qVar3 != 0) {
        constData((QString *)0x509f42);
        size((QString *)in_RSI);
        append((QString *)this_00,(QChar *)in_RSI,(qsizetype)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString &QString::append(const QString &str)
{
    if (!str.isNull()) {
        if (isNull()) {
            if (Q_UNLIKELY(!str.d.isMutable()))
                assign(str); // fromRawData, so we do a deep copy
            else
                operator=(str);
        } else if (str.size()) {
            append(str.constData(), str.size());
        }
    }
    return *this;
}